

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall yy::parser::yy_reduce_print_(parser *this,int yyrule)

{
  short sVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  undefined8 uStack_38;
  
  sVar1 = *(short *)(yyrline_ + (long)yyrule * 2);
  lVar4 = (long)(char)yyr2_[yyrule];
  poVar2 = this->yycdebug_;
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Reducing stack by rule ",0x17);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,yyrule + -1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," (line ",7);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"):\n",3);
  if (0 < lVar4) {
    lVar3 = 0;
    do {
      if (this->yydebug_ != 0) {
        poVar2 = this->yycdebug_;
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   $",4);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," =",2);
        uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 6),1);
        yy_print_<yy::parser::by_state>
                  (this,this->yycdebug_,
                   &(this->yystack_).seq_.
                    super__Vector_base<yy::parser::stack_symbol_type,_std::allocator<yy::parser::stack_symbol_type>_>
                    ._M_impl.super__Vector_impl_data._M_finish[lVar3 - lVar4].
                    super_basic_symbol<yy::parser::by_state>);
        uStack_38 = CONCAT17(10,(undefined7)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->yycdebug_,(char *)((long)&uStack_38 + 7),1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar4);
  }
  return;
}

Assistant:

void
  parser::yy_reduce_print_ (int yyrule) const
  {
    int yylno = yyrline_[yyrule];
    int yynrhs = yyr2_[yyrule];
    // Print the symbols being reduced, and their result.
    *yycdebug_ << "Reducing stack by rule " << yyrule - 1
               << " (line " << yylno << "):\n";
    // The symbols being reduced.
    for (int yyi = 0; yyi < yynrhs; yyi++)
      YY_SYMBOL_PRINT ("   $" << yyi + 1 << " =",
                       yystack_[(yynrhs) - (yyi + 1)]);
  }